

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall
QHttpThreadDelegate::synchronousAuthenticationRequiredSlot
          (QHttpThreadDelegate *this,QHttpNetworkRequest *request,QAuthenticator *a)

{
  QNetworkAccessAuthenticationManager *this_00;
  long in_FS_OFFSET;
  QNetworkAuthenticationCredential credential;
  undefined1 local_80 [16];
  undefined1 *puStack_70;
  undefined1 *local_68;
  QString QStack_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = *(QNetworkAccessAuthenticationManager **)(this + 0x78);
    QHttpNetworkRequest::url((QHttpNetworkRequest *)local_80);
    QNetworkAccessAuthenticationManager::fetchCachedCredentials
              ((QNetworkAuthenticationCredential *)(local_80 + 8),this_00,(QUrl *)local_80,a);
    QUrl::~QUrl((QUrl *)local_80);
    if (((puStack_70 != (undefined1 *)0x0) || (QStack_60.d.ptr != (char16_t *)0x0)) ||
       (local_48.d.ptr != (char16_t *)0x0)) {
      QAuthenticator::setUser(a,&QStack_60);
      QAuthenticator::setPassword(a,&local_48);
    }
    QObject::disconnect(*(QObject **)(this + 0x150),
                        "2authenticationRequired(QHttpNetworkRequest,QAuthenticator*)",
                        (QObject *)this,
                        "1synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)"
                       );
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(QStack_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QHttpNetworkRequestPrivate *)local_80._8_8_ != (QHttpNetworkRequestPrivate *)0x0) {
      LOCK();
      *(int *)local_80._8_8_ = *(int *)local_80._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_80._8_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_80._8_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::synchronousAuthenticationRequiredSlot(const QHttpNetworkRequest &request, QAuthenticator *a)
{
    if (!httpReply)
        return;

    Q_UNUSED(request);
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousAuthenticationRequiredSlot() thread=" << QThread::currentThreadId();
#endif

    // Ask the credential cache
    QNetworkAuthenticationCredential credential = authenticationManager->fetchCachedCredentials(httpRequest.url(), a);
    if (!credential.isNull()) {
        a->setUser(credential.user);
        a->setPassword(credential.password);
    }

    // Disconnect this connection now since we only want to ask the authentication cache once.
    QObject::disconnect(httpReply, SIGNAL(authenticationRequired(QHttpNetworkRequest,QAuthenticator*)),
        this, SLOT(synchronousAuthenticationRequiredSlot(QHttpNetworkRequest,QAuthenticator*)));
}